

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O0

void reset(btbb_piconet *pn)

{
  int iVar1;
  btbb_piconet *pn_local;
  
  iVar1 = btbb_piconet_get_flag(pn,9);
  if (iVar1 != 0) {
    free(pn->clock_candidates);
    pn->sequence = (char *)0x0;
  }
  btbb_piconet_set_flag(pn,10,0);
  btbb_piconet_set_flag(pn,9,0);
  btbb_piconet_set_flag(pn,2,0);
  btbb_piconet_set_flag(pn,4,0);
  btbb_piconet_set_flag(pn,5,0);
  pn->packets_observed = 0;
  iVar1 = btbb_piconet_get_flag(pn,0xc);
  btbb_piconet_set_flag(pn,0xb,iVar1);
  btbb_piconet_set_flag(pn,0xc,0);
  return;
}

Assistant:

static void reset(btbb_piconet *pn)
{
	//printf("no candidates remaining! starting over . . .\n");

	if(btbb_piconet_get_flag(pn, BTBB_HOP_REVERSAL_INIT)) {
		free(pn->clock_candidates);
		pn->sequence = NULL;
	}
	btbb_piconet_set_flag(pn, BTBB_GOT_FIRST_PACKET, 0);
	btbb_piconet_set_flag(pn, BTBB_HOP_REVERSAL_INIT, 0);
	btbb_piconet_set_flag(pn, BTBB_UAP_VALID, 0);
	btbb_piconet_set_flag(pn, BTBB_CLK6_VALID, 0);
	btbb_piconet_set_flag(pn, BTBB_CLK27_VALID, 0);
	pn->packets_observed = 0;

	/*
	 * If we have recently observed two packets in a row on the same
	 * channel, try AFH next time.  If not, don't.
	 */
	btbb_piconet_set_flag(pn, BTBB_IS_AFH,
			      btbb_piconet_get_flag(pn, BTBB_LOOKS_LIKE_AFH));
	btbb_piconet_set_flag(pn, BTBB_LOOKS_LIKE_AFH, 0);
	//int i;
	//for(i=0; i<10; i++)
	//	pn->afh_map[i] = 0;
}